

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerimeterPointCoordinate.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::PerimeterPointCoordinate::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,PerimeterPointCoordinate *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"X: ",3);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32X);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",  Y: ",6);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32Y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString PerimeterPointCoordinate::GetAsString() const
{
    KStringStream ss;

    ss << "X: "    << m_f32X
       << ",  Y: " << m_f32Y
       << "\n";

    return ss.str();
}